

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O1

void __thiscall flow::lang::Lexer::~Lexer(Lexer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->stringValue_)._M_dataplus._M_p;
  paVar1 = &(this->stringValue_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->location_).filename._M_dataplus._M_p;
  paVar1 = &(this->location_).filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->lastLocation_).filename._M_dataplus._M_p;
  paVar1 = &(this->lastLocation_).filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::__cxx11::
  _List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
  ::_M_clear(&(this->contexts_).
              super__List_base<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>,_std::allocator<std::unique_ptr<flow::lang::Lexer::Scope,_std::default_delete<flow::lang::Lexer::Scope>_>_>_>
            );
  return;
}

Assistant:

~Lexer() = default;